

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O2

iterator __thiscall
threadsafe::ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link>::erase
          (ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *this,iterator *start,iterator *end
          )

{
  long *in_RCX;
  Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> local_40;
  
  while (end->node_ != (node_pointer_type)*in_RCX) {
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::Iterator(&local_40,end);
    erase((ring_buffer<sig::ProtoSignal<void_(bool,_int)>::Link> *)&stack0xffffffffffffffc8,start);
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::operator=
              (end,(Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)
                   &stack0xffffffffffffffc8);
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::~Iterator
              ((Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)&stack0xffffffffffffffc8
              );
    impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::~Iterator(&local_40);
  }
  impl::Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false>::Iterator
            ((Iterator<sig::ProtoSignal<void_(bool,_int)>::Link,_false> *)this,end);
  return (iterator)&this->root_;
}

Assistant:

iterator erase(iterator start, iterator end) {
        for(; start != end;) {
            start = erase(start);
        }
        return start;
    }